

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

AsyncIoContext * kj::setupAsyncIo(void)

{
  RefOrVoid<kj::(anonymous_namespace)::LowLevelAsyncIoProviderImpl> params;
  LowLevelAsyncIoProviderImpl *pLVar1;
  WaitScope *pWVar2;
  UnixEventPort *pUVar3;
  Own<kj::(anonymous_namespace)::LowLevelAsyncIoProviderImpl> *other;
  Own<kj::(anonymous_namespace)::AsyncIoProviderImpl> *other_00;
  AsyncIoContext *in_RDI;
  UnixEventPort *eventPort;
  WaitScope *waitScope;
  undefined1 local_30 [8];
  Own<kj::(anonymous_namespace)::AsyncIoProviderImpl> ioProvider;
  Own<kj::(anonymous_namespace)::LowLevelAsyncIoProviderImpl> lowLevel;
  
  heap<kj::(anonymous_namespace)::LowLevelAsyncIoProviderImpl>();
  params = Own<kj::(anonymous_namespace)::LowLevelAsyncIoProviderImpl>::operator*
                     ((Own<kj::(anonymous_namespace)::LowLevelAsyncIoProviderImpl> *)&ioProvider.ptr
                     );
  heap<kj::(anonymous_namespace)::AsyncIoProviderImpl,kj::(anonymous_namespace)::LowLevelAsyncIoProviderImpl&>
            ((kj *)local_30,params);
  pLVar1 = Own<kj::(anonymous_namespace)::LowLevelAsyncIoProviderImpl>::operator->
                     ((Own<kj::(anonymous_namespace)::LowLevelAsyncIoProviderImpl> *)&ioProvider.ptr
                     );
  pWVar2 = anon_unknown_30::LowLevelAsyncIoProviderImpl::getWaitScope(pLVar1);
  pLVar1 = Own<kj::(anonymous_namespace)::LowLevelAsyncIoProviderImpl>::operator->
                     ((Own<kj::(anonymous_namespace)::LowLevelAsyncIoProviderImpl> *)&ioProvider.ptr
                     );
  pUVar3 = anon_unknown_30::LowLevelAsyncIoProviderImpl::getEventPort(pLVar1);
  other = mv<kj::Own<kj::(anonymous_namespace)::LowLevelAsyncIoProviderImpl>>
                    ((Own<kj::(anonymous_namespace)::LowLevelAsyncIoProviderImpl> *)&ioProvider.ptr)
  ;
  Own<kj::LowLevelAsyncIoProvider>::Own<kj::(anonymous_namespace)::LowLevelAsyncIoProviderImpl,void>
            (&in_RDI->lowLevelProvider,other);
  other_00 = mv<kj::Own<kj::(anonymous_namespace)::AsyncIoProviderImpl>>
                       ((Own<kj::(anonymous_namespace)::AsyncIoProviderImpl> *)local_30);
  Own<kj::AsyncIoProvider>::Own<kj::(anonymous_namespace)::AsyncIoProviderImpl,void>
            (&in_RDI->provider,other_00);
  in_RDI->waitScope = pWVar2;
  in_RDI->unixEventPort = pUVar3;
  Own<kj::(anonymous_namespace)::AsyncIoProviderImpl>::~Own
            ((Own<kj::(anonymous_namespace)::AsyncIoProviderImpl> *)local_30);
  Own<kj::(anonymous_namespace)::LowLevelAsyncIoProviderImpl>::~Own
            ((Own<kj::(anonymous_namespace)::LowLevelAsyncIoProviderImpl> *)&ioProvider.ptr);
  return in_RDI;
}

Assistant:

AsyncIoContext setupAsyncIo() {
  auto lowLevel = heap<LowLevelAsyncIoProviderImpl>();
  auto ioProvider = kj::heap<AsyncIoProviderImpl>(*lowLevel);
  auto& waitScope = lowLevel->getWaitScope();
  auto& eventPort = lowLevel->getEventPort();
  return { kj::mv(lowLevel), kj::mv(ioProvider), waitScope, eventPort };
}